

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

void Vec_VecFree(Vec_Vec_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  undefined4 local_1c;
  int i;
  Vec_Ptr_t *vVec;
  Vec_Vec_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_VecSize(p), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = Vec_VecEntry(p,local_1c);
    if (p_00 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p_00);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p);
  return;
}

Assistant:

static inline void Vec_VecFree( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i;
    Vec_VecForEachLevel( p, vVec, i )
        if ( vVec ) Vec_PtrFree( vVec );
    Vec_PtrFree( (Vec_Ptr_t *)p );
}